

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cc
# Opt level: O0

void __thiscall raptor::Connection::Connection(Connection *this,INotificationTransfer *service)

{
  INotificationTransfer *service_local;
  Connection *this_local;
  
  this->_service = service;
  this->_proto = (IProtocol *)0x0;
  this->_fd = -1;
  this->_cid = 0xffffffffffffffff;
  this->_rcv_thd = (SendRecvThread *)0x0;
  this->_snd_thd = (SendRecvThread *)0x0;
  SliceBuffer::SliceBuffer(&this->_rcv_buffer);
  SliceBuffer::SliceBuffer(&this->_snd_buffer);
  Mutex::Mutex(&this->_rcv_mutex);
  Mutex::Mutex(&this->_snd_mutex);
  Slice::Slice(&this->_addr_str);
  this->_user_data = 0;
  this->_extend_ptr = (void *)0x0;
  return;
}

Assistant:

Connection::Connection(internal::INotificationTransfer* service)
    : _service(service)
    , _proto(nullptr)
    , _fd(-1)
    , _cid(core::InvalidConnectionId)
    , _rcv_thd(nullptr)
    , _snd_thd(nullptr) {

    _user_data = 0;
    _extend_ptr = nullptr;
}